

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.hpp
# Opt level: O0

void BCL::barrier(void)

{
  debug_error *pdVar1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_5d;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  int local_c;
  int error_code;
  
  local_c = MPI_Win_flush_all(win);
  if (local_c != 0) {
    local_5d = 1;
    pdVar1 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_50,local_c);
    std::operator+(&local_30,"BCL barrier(): MPI_Win_lock_all returned error code ",&local_50);
    debug_error::debug_error(pdVar1,&local_30);
    local_5d = 0;
    __cxa_throw(pdVar1,&debug_error::typeinfo,debug_error::~debug_error);
  }
  local_c = MPI_Barrier(comm);
  if (local_c != 0) {
    pdVar1 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_a0,local_c);
    std::operator+(&local_80,"BCL barrier(): MPI_Barrier returned error code ",&local_a0);
    debug_error::debug_error(pdVar1,&local_80);
    __cxa_throw(pdVar1,&debug_error::typeinfo,debug_error::~debug_error);
  }
  return;
}

Assistant:

void barrier() {
  int error_code = MPI_Win_flush_all(win);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL barrier(): MPI_Win_lock_all returned error code " + std::to_string(error_code));
          }
  )
  error_code = MPI_Barrier(BCL::comm);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL barrier(): MPI_Barrier returned error code " + std::to_string(error_code));
          }
  )
}